

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O2

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float in_register_000012dc;
  
  uVar3 = a->c;
  iVar13 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar10 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    iVar10 = 0;
    uVar19 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar19 = 0;
    }
    for (uVar11 = 0; uVar11 != uVar19; uVar11 = uVar11 + 1) {
      lVar12 = a->elemsize * a->cstep * uVar11;
      pvVar4 = a->data;
      lVar14 = b->elemsize * b->cstep * uVar11;
      pvVar5 = b->data;
      lVar15 = c->elemsize * c->cstep * uVar11;
      pvVar6 = c->data;
      lVar16 = 0;
      lVar17 = 0;
      for (iVar18 = 0; iVar18 + 7 < iVar13; iVar18 = iVar18 + 8) {
        auVar2 = *(undefined1 (*) [32])((long)pvVar4 + lVar17 + lVar12);
        auVar21 = *(undefined1 (*) [32])((long)pvVar5 + lVar17 + lVar14);
        auVar8 = vrcpps_avx(auVar21);
        fVar23 = auVar2._0_4_ * auVar8._0_4_;
        fVar24 = auVar2._4_4_ * auVar8._4_4_;
        fVar25 = auVar2._8_4_ * auVar8._8_4_;
        fVar26 = auVar2._12_4_ * auVar8._12_4_;
        fVar27 = auVar2._16_4_ * auVar8._16_4_;
        fVar28 = auVar2._20_4_ * auVar8._20_4_;
        fVar29 = auVar2._24_4_ * auVar8._24_4_;
        auVar9._4_4_ = auVar21._4_4_ * fVar24;
        auVar9._0_4_ = auVar21._0_4_ * fVar23;
        auVar9._8_4_ = auVar21._8_4_ * fVar25;
        auVar9._12_4_ = auVar21._12_4_ * fVar26;
        auVar9._16_4_ = auVar21._16_4_ * fVar27;
        auVar9._20_4_ = auVar21._20_4_ * fVar28;
        auVar9._24_4_ = auVar21._24_4_ * fVar29;
        auVar9._28_4_ = auVar21._28_4_;
        auVar2 = vsubps_avx(auVar2,auVar9);
        auVar21._0_4_ = fVar23 + auVar8._0_4_ * auVar2._0_4_;
        auVar21._4_4_ = fVar24 + auVar8._4_4_ * auVar2._4_4_;
        auVar21._8_4_ = fVar25 + auVar8._8_4_ * auVar2._8_4_;
        auVar21._12_4_ = fVar26 + auVar8._12_4_ * auVar2._12_4_;
        auVar21._16_4_ = fVar27 + auVar8._16_4_ * auVar2._16_4_;
        auVar21._20_4_ = fVar28 + auVar8._20_4_ * auVar2._20_4_;
        auVar21._24_4_ = fVar29 + auVar8._24_4_ * auVar2._24_4_;
        auVar21._28_4_ = in_register_000012dc + auVar2._28_4_;
        *(undefined1 (*) [32])((long)pvVar6 + lVar17 + lVar15) = auVar21;
        lVar17 = lVar17 + 0x20;
        lVar16 = lVar16 + 8;
      }
      for (; iVar18 + 3 < iVar13; iVar18 = iVar18 + 4) {
        auVar1 = *(undefined1 (*) [16])((long)pvVar4 + lVar17 + lVar12);
        auVar20 = *(undefined1 (*) [16])((long)pvVar5 + lVar17 + lVar14);
        auVar7 = vrcpps_avx(auVar20);
        fVar23 = auVar1._0_4_ * auVar7._0_4_;
        fVar24 = auVar1._4_4_ * auVar7._4_4_;
        fVar25 = auVar1._8_4_ * auVar7._8_4_;
        fVar26 = auVar1._12_4_ * auVar7._12_4_;
        in_register_000012dc = 0.0;
        auVar22._0_4_ = auVar20._0_4_ * fVar23;
        auVar22._4_4_ = auVar20._4_4_ * fVar24;
        auVar22._8_4_ = auVar20._8_4_ * fVar25;
        auVar22._12_4_ = auVar20._12_4_ * fVar26;
        auVar1 = vsubps_avx(auVar1,auVar22);
        auVar20._0_4_ = fVar23 + auVar7._0_4_ * auVar1._0_4_;
        auVar20._4_4_ = fVar24 + auVar7._4_4_ * auVar1._4_4_;
        auVar20._8_4_ = fVar25 + auVar7._8_4_ * auVar1._8_4_;
        auVar20._12_4_ = fVar26 + auVar7._12_4_ * auVar1._12_4_;
        *(undefined1 (*) [16])((long)pvVar6 + lVar17 + lVar15) = auVar20;
        lVar17 = lVar17 + 0x10;
        lVar16 = lVar16 + 4;
      }
      for (; (int)lVar16 < iVar13; lVar16 = lVar16 + 1) {
        *(float *)((long)pvVar6 + lVar16 * 4 + lVar15) =
             *(float *)((long)pvVar4 + lVar16 * 4 + lVar12) /
             *(float *)((long)pvVar5 + lVar16 * 4 + lVar14);
      }
    }
  }
  return iVar10;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}